

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void CheckCaption(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  AttVal *av;
  uint vers;
  
  prvTidyCheckAttributes(doc,node);
  av = prvTidyAttrGetById(node,TidyAttr_ALIGN);
  if ((av == (AttVal *)0x0) || (av->value == (ctmbstr)0x0)) {
    return;
  }
  iVar1 = prvTidytmbstrcasecmp(av->value,"left");
  if (iVar1 != 0) {
    if (av->value == (ctmbstr)0x0) goto LAB_001448e9;
    iVar1 = prvTidytmbstrcasecmp(av->value,"right");
    if (iVar1 != 0) {
      if (av->value == (ctmbstr)0x0) goto LAB_001448e9;
      iVar1 = prvTidytmbstrcasecmp(av->value,"top");
      if (iVar1 != 0) {
        if (av->value == (ctmbstr)0x0) {
LAB_001448e9:
          prvTidyReportAttrError(doc,node,av,0x22b);
          return;
        }
        iVar1 = prvTidytmbstrcasecmp(av->value,"bottom");
        if (iVar1 != 0) goto LAB_001448e9;
      }
      vers = 0xfffffffc;
      goto LAB_0014490f;
    }
  }
  vers = 0x248;
LAB_0014490f:
  prvTidyConstrainVersion(doc,vers);
  return;
}

Assistant:

void CheckCaption(TidyDocImpl* doc, Node *node)
{
    AttVal *attval;

    TY_(CheckAttributes)(doc, node);

    attval = TY_(AttrGetById)(node, TidyAttr_ALIGN);

    if (!AttrHasValue(attval))
        return;

    if (AttrValueIs(attval, "left") || AttrValueIs(attval, "right"))
        TY_(ConstrainVersion)(doc, VERS_HTML40_LOOSE);
    else if (AttrValueIs(attval, "top") || AttrValueIs(attval, "bottom"))
        TY_(ConstrainVersion)(doc, ~(VERS_HTML20|VERS_HTML32));
    else
        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
}